

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O2

void waluigi(dw_rom *rom)

{
  vpatch(rom,0x13b4,0x50,0x50,2,0x51,2,0x52,2,0x53,2,0x54,2,0x55,2,0x56,2,0x57,2,0x50,2,0x51,2,0x52,
         2,0x53,2,0x54,2,0x55,2,0x56,2,0x57,2,0x50,2,0x51,2,0x52,2,0x53,2,0x54,2,0x55,2,0x56,2,0x57,
         2,0x50,2,0x51,2,0x52,2,0x53,2,0x54,2,0x55,2,0x56,2,0x57,2,0x50);
  vpatch(rom,0x14b4,0x4e,0x48,2,0x49,2,0x4a,2,0x4b,2,0x4c,2,0x4d,2,0x4e,2,0x4f,2,0x48,2,0x49,2,0x4a,
         2,0x4b,2,0x4c,2,0x4d,2,0x4e,2,0x4f,2,0x48,2,0x49,2,0x4a,2,0x4b,2,0x4c,2,0x4d,2,0x4e,2,0x4f,
         2,0x48,2,0x49,2,0x4a,2,0x4b,2,0x4c,2,0x4d,2,0x4e,2,0x4f,2,0x48);
  vpatch(rom,0x15b4,0x44,0x30,2,0x31,2,0x32,2,0x33,2,0x34,2,0x35,2,0x36,2,0x37,2,0x30,2,0x31,2,0x32,
         2,0x33,2,0x34,2,0x35,2,0x36,2,0x37,2,0x30,2,0x31,2,0x32,2,0x33,2,0x34,2,0x35,2,0x36,2,0x37,
         2,0x30,2,0x31,2,0x32,2,0x33,2,0x34,2,0x35,2,0x36,2,0x37,2,0xb4);
  vpatch(rom,0x15fe,2,0x35,2);
  vpatch(rom,0x16b4,0x44,0x40,2,0x41,2,0x42,2,0x43,2,0x44,2,0x45,2,0x46,2,0x47,2,0x40,2,0x41,2,0x42,
         2,0x43,2,0x44,2,0x45,2,0x46,2,0x47,2,0x40,2,0x41,2,0x42,2,0x43,2,0x44,2,0x45,2,0x46,2,0x47,
         2,0x40,2,0x41,2,0x42,2,0x43,2,0x44,2,0x45,2,0x46,2,0x47,2,0xb8);
  vpatch(rom,0x16fe,2,0x45,2);
  vpatch(rom,0x1a92,2,0x13,0xf);
  vpatch(rom,0x12300,0x80,7,8,0x10,0x3f,0x7f,0x7f,0x3f,0x1f,7,0xf,0x1f,0x32,0x52,0x44,0x27,0x18,0xe0
         ,0x10,8,0xfc,0xfe,0xfe,0xfc,0xf8,0xe0,0xf0,0xf8,0x4c,0x4a,0x22,0xe4,0x18,0x3f,0x3c,0x3e,
         0x1f,0x1f,0xf,8,7,0x27,0x27,0x3f,0x1d,0x1f,0xf,0xf,7,0xe8,0x3c,0x7c,0xf8,0xf8,0x88,0xf0,0,
         0xf8,0xe4,0xe4,0xb8,0xf8,0xf8,0xf0,0,7);
  vpatch(rom,0x12400,0x180);
  return;
}

Assistant:

static void waluigi(dw_rom *rom)
{
    vpatch(rom, 0x013b4,   80,  0x50,  0x02,  0x51,  0x02,  0x52,  0x02,  0x53,  0x02,  0x54,  0x02,  0x55,  0x02,  0x56,  0x02,  0x57,  0x02,  0x50,  0x02,  0x51,  0x02,  0x52,  0x02,  0x53,  0x02,  0x54,  0x02,  0x55,  0x02,  0x56,  0x02,  0x57,  0x02,  0x50,  0x02,  0x51,  0x02,  0x52,  0x02,  0x53,  0x02,  0x54,  0x02,  0x55,  0x02,  0x56,  0x02,  0x57,  0x02,  0x50,  0x02,  0x51,  0x02,  0x52,  0x02,  0x53,  0x02,  0x54,  0x02,  0x55,  0x02,  0x56,  0x02,  0x57,  0x02,  0x50,  0x02,  0x51,  0x02,  0x52,  0x02,  0x53,  0x02,  0x54,  0x02,  0x55,  0x02,  0x56,  0x02,  0x57,  0x02);
    vpatch(rom, 0x014b4,   78,  0x48,  0x02,  0x49,  0x02,  0x4a,  0x02,  0x4b,  0x02,  0x4c,  0x02,  0x4d,  0x02,  0x4e,  0x02,  0x4f,  0x02,  0x48,  0x02,  0x49,  0x02,  0x4a,  0x02,  0x4b,  0x02,  0x4c,  0x02,  0x4d,  0x02,  0x4e,  0x02,  0x4f,  0x02,  0x48,  0x02,  0x49,  0x02,  0x4a,  0x02,  0x4b,  0x02,  0x4c,  0x02,  0x4d,  0x02,  0x4e,  0x02,  0x4f,  0x02,  0x48,  0x02,  0x49,  0x02,  0x4a,  0x02,  0x4b,  0x02,  0x4c,  0x02,  0x4d,  0x02,  0x4e,  0x02,  0x4f,  0x02,  0x48,  0x02,  0xa9,  0x03,  0x4a,  0x02,  0xab,  0x03,  0x4c,  0x02,  0xad,  0x03,  0x4e,  0x02);
    vpatch(rom, 0x015b4,   68,  0x30,  0x02,  0x31,  0x02,  0x32,  0x02,  0x33,  0x02,  0x34,  0x02,  0x35,  0x02,  0x36,  0x02,  0x37,  0x02,  0x30,  0x02,  0x31,  0x02,  0x32,  0x02,  0x33,  0x02,  0x34,  0x02,  0x35,  0x02,  0x36,  0x02,  0x37,  0x02,  0x30,  0x02,  0x31,  0x02,  0x32,  0x02,  0x33,  0x02,  0x34,  0x02,  0x35,  0x02,  0x36,  0x02,  0x37,  0x02,  0x30,  0x02,  0x31,  0x02,  0x32,  0x02,  0x33,  0x02,  0x34,  0x02,  0x35,  0x02,  0x36,  0x02,  0x37,  0x02,  0xb4,  0x03,  0x31,  0x02);
    vpatch(rom, 0x015fe,    2,  0x35,  0x02);
    vpatch(rom, 0x016b4,   68,  0x40,  0x02,  0x41,  0x02,  0x42,  0x02,  0x43,  0x02,  0x44,  0x02,  0x45,  0x02,  0x46,  0x02,  0x47,  0x02,  0x40,  0x02,  0x41,  0x02,  0x42,  0x02,  0x43,  0x02,  0x44,  0x02,  0x45,  0x02,  0x46,  0x02,  0x47,  0x02,  0x40,  0x02,  0x41,  0x02,  0x42,  0x02,  0x43,  0x02,  0x44,  0x02,  0x45,  0x02,  0x46,  0x02,  0x47,  0x02,  0x40,  0x02,  0x41,  0x02,  0x42,  0x02,  0x43,  0x02,  0x44,  0x02,  0x45,  0x02,  0x46,  0x02,  0x47,  0x02,  0xb8,  0x03,  0x41,  0x02);
    vpatch(rom, 0x016fe,    2,  0x45,  0x02);
    vpatch(rom, 0x01a92,    2,  0x13,  0x0f);
    vpatch(rom, 0x12300,  128,  0x07,  0x08,  0x10,  0x3f,  0x7f,  0x7f,  0x3f,  0x1f,  0x07,  0x0f,  0x1f,  0x32,  0x52,  0x44,  0x27,  0x18,  0xe0,  0x10,  0x08,  0xfc,  0xfe,  0xfe,  0xfc,  0xf8,  0xe0,  0xf0,  0xf8,  0x4c,  0x4a,  0x22,  0xe4,  0x18,  0x3f,  0x3c,  0x3e,  0x1f,  0x1f,  0x0f,  0x08,  0x07,  0x27,  0x27,  0x3f,  0x1d,  0x1f,  0x0f,  0x0f,  0x07,  0xe8,  0x3c,  0x7c,  0xf8,  0xf8,  0x88,  0xf0,  0x00,  0xf8,  0xe4,  0xe4,  0xb8,  0xf8,  0xf8,  0xf0,  0x00,  0x07,  0x08,  0x10,  0x3f,  0x7f,  0x7f,  0x3f,  0x1f,  0x07,  0x0f,  0x1f,  0x32,  0x52,  0x44,  0x27,  0x18,  0xe0,  0x10,  0x08,  0xfc,  0xfe,  0xfe,  0xfc,  0xf8,  0xe0,  0xf0,  0xf8,  0x4c,  0x4a,  0x22,  0xe4,  0x18,  0x17,  0x3c,  0x3e,  0x1f,  0x1f,  0x11,  0x0f,  0x00,  0x1f,  0x27,  0x27,  0x1d,  0x1f,  0x1f,  0x0f,  0x00,  0xfc,  0x3c,  0x7c,  0xf8,  0xf8,  0xf0,  0x10,  0xe0,  0xe4,  0xe4,  0xfc,  0xb8,  0xf8,  0xf0,  0xf0,  0xe0);
    vpatch(rom, 0x12400,  384,  0x03,  0x1c,  0x20,  0x1f,  0x3f,  0x3f,  0x1f,  0x0f,  0x03,  0x1f,  0x3f,  0x1d,  0x21,  0x22,  0x1f,  0x08,  0xe0,  0x10,  0x08,  0xf8,  0xfc,  0xfc,  0xf8,  0xf8,  0xe0,  0xf0,  0xf8,  0x38,  0x64,  0x64,  0x18,  0x38,  0x1c,  0x29,  0x6f,  0x7f,  0x27,  0x23,  0x11,  0x0e,  0x1f,  0x3f,  0x5f,  0x56,  0x3f,  0x3f,  0x1f,  0x0e,  0xc6,  0x87,  0xcf,  0xfe,  0xfc,  0xf2,  0x22,  0x1c,  0xfe,  0xf9,  0xf1,  0xf2,  0xfc,  0xfe,  0x3e,  0x1c,  0x00,  0x07,  0x18,  0x20,  0x1f,  0x3f,  0x3f,  0x1f,  0x00,  0x07,  0x1f,  0x3f,  0x1d,  0x21,  0x22,  0x1f,  0x00,  0xe0,  0x10,  0x08,  0xf8,  0xfc,  0xfc,  0xf8,  0x00,  0xe0,  0xf0,  0xf8,  0x38,  0x64,  0x64,  0x18,  0x0f,  0x04,  0x09,  0x0f,  0x0f,  0x0e,  0x04,  0x07,  0x08,  0x07,  0x0f,  0x0f,  0x0d,  0x0f,  0x07,  0x07,  0xf0,  0xc8,  0x84,  0x84,  0xf8,  0x38,  0x10,  0xf0,  0x30,  0xf8,  0xfc,  0xfc,  0x88,  0xc8,  0xf0,  0xf0,  0x00,  0x07,  0x08,  0x10,  0x1f,  0x3f,  0x3f,  0x1f,  0x00,  0x07,  0x0f,  0x1f,  0x1c,  0x26,  0x26,  0x18,  0x00,  0xe0,  0x18,  0x04,  0xf8,  0xfc,  0xfc,  0xf8,  0x00,  0xe0,  0xf8,  0xfc,  0xb8,  0x84,  0x44,  0xf8,  0x0f,  0x13,  0x21,  0x21,  0x1f,  0x1c,  0x08,  0x0f,  0x0c,  0x1f,  0x3f,  0x3f,  0x11,  0x13,  0x0f,  0x0f,  0xf0,  0x20,  0x90,  0xf0,  0xf0,  0x70,  0x20,  0xe0,  0x10,  0xe0,  0xf0,  0xf0,  0xb0,  0xf0,  0xe0,  0xe0,  0x07,  0x08,  0x10,  0x1f,  0x3f,  0x3f,  0x1f,  0x1f,  0x07,  0x0f,  0x1f,  0x1c,  0x26,  0x26,  0x18,  0x1c,  0xc0,  0x38,  0x04,  0xf8,  0xfc,  0xfc,  0xf8,  0xf0,  0xc0,  0xf8,  0xfc,  0xb8,  0x84,  0x44,  0xf8,  0x10,  0x63,  0xe1,  0xf3,  0x7f,  0x3f,  0x4f,  0x44,  0x38,  0x7f,  0x9f,  0x8f,  0x4f,  0x3f,  0x7f,  0x7c,  0x38,  0x38,  0x94,  0xf6,  0xfe,  0xe4,  0xc4,  0x88,  0x70,  0xf8,  0xfc,  0xfa,  0x6a,  0xfc,  0xfc,  0xf8,  0x70,  0x00,  0x03,  0x0c,  0x10,  0x30,  0x78,  0x7f,  0x3f,  0x00,  0x03,  0x0f,  0x1f,  0x3f,  0x5f,  0x4f,  0x27,  0x00,  0xc0,  0x30,  0x08,  0x0c,  0x1e,  0xfe,  0xfc,  0x00,  0xc0,  0xf0,  0xf8,  0xfc,  0xfa,  0xf2,  0xe4,  0x1f,  0x17,  0x3c,  0x3e,  0x1f,  0x0f,  0x08,  0x07,  0x18,  0x1f,  0x27,  0x27,  0x1f,  0x0f,  0x0f,  0x07,  0xf8,  0xfc,  0x3c,  0x78,  0xf8,  0x88,  0xf0,  0x00,  0x18,  0xe4,  0xe4,  0xf8,  0xf8,  0xf8,  0xf0,  0x00,  0x00,  0x03,  0x0c,  0x10,  0x30,  0x78,  0x7f,  0x3f,  0x00,  0x03,  0x0f,  0x1f,  0x3f,  0x5f,  0x4f,  0x27,  0x00,  0xc0,  0x30,  0x08,  0x0c,  0x1e,  0xfe,  0xfc,  0x00,  0xc0,  0xf0,  0xf8,  0xfc,  0xfa,  0xf2,  0xe4,  0x1f,  0x3f,  0x3c,  0x1e,  0x1f,  0x11,  0x0f,  0x00,  0x18,  0x27,  0x27,  0x1f,  0x1f,  0x1f,  0x0f,  0x00,  0xf8,  0xe8,  0x3c,  0x7c,  0xf8,  0xf0,  0x10,  0xe0,  0x18,  0xf8,  0xe4,  0xe4,  0xf8,  0xf0,  0xf0,  0xe0);
}